

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bundles.c
# Opt level: O3

CURLcode Curl_bundle_create(SessionHandle *data,connectbundle **cb_ptr)

{
  CURLcode CVar1;
  connectbundle *pcVar2;
  curl_llist *pcVar3;
  
  pcVar2 = (connectbundle *)(*Curl_cmalloc)(0x18);
  *cb_ptr = pcVar2;
  CVar1 = CURLE_OUT_OF_MEMORY;
  if (pcVar2 != (connectbundle *)0x0) {
    pcVar2->num_connections = 0;
    pcVar2->server_supports_pipelining = false;
    pcVar3 = Curl_llist_alloc(conn_llist_dtor);
    (*cb_ptr)->conn_list = pcVar3;
    CVar1 = CURLE_OK;
    if ((*cb_ptr)->conn_list == (curl_llist *)0x0) {
      (*Curl_cfree)(*cb_ptr);
      *cb_ptr = (connectbundle *)0x0;
      CVar1 = CURLE_OUT_OF_MEMORY;
    }
  }
  return CVar1;
}

Assistant:

CURLcode Curl_bundle_create(struct SessionHandle *data,
                            struct connectbundle **cb_ptr)
{
  (void)data;
  DEBUGASSERT(*cb_ptr == NULL);
  *cb_ptr = malloc(sizeof(struct connectbundle));
  if(!*cb_ptr)
    return CURLE_OUT_OF_MEMORY;

  (*cb_ptr)->num_connections = 0;
  (*cb_ptr)->server_supports_pipelining = FALSE;

  (*cb_ptr)->conn_list = Curl_llist_alloc((curl_llist_dtor) conn_llist_dtor);
  if(!(*cb_ptr)->conn_list) {
    Curl_safefree(*cb_ptr);
    return CURLE_OUT_OF_MEMORY;
  }
  return CURLE_OK;
}